

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnglite.c
# Opt level: O3

int png_get_data(png_t *png,uchar *data)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  undefined4 uVar4;
  uint uVar5;
  size_t sVar6;
  uchar *puVar7;
  undefined8 *puVar8;
  size_t sVar9;
  uint uVar10;
  size_t in_RCX;
  uchar *prev_line;
  size_t __n;
  byte bVar11;
  uint uVar12;
  uchar *puVar13;
  uchar uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  long in_FS_OFFSET;
  uint length;
  uint type;
  uint length_1;
  uint type_1;
  void *local_60;
  uint local_4c;
  int local_48;
  uint local_44;
  uint local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  png->png_data = (uchar *)0x0;
  png->zs = (void *)0x0;
  iVar18 = 0;
LAB_001ae2ab:
  if (iVar18 == 0) {
    file_read_ul(png,&local_4c);
    sVar6 = file_read(png,&local_48,4,in_RCX);
    iVar18 = -1;
    if (sVar6 == 4) {
      if (local_48 == 0x444e4549) {
        iVar18 = 1;
      }
      else if (local_48 == 0x54414449) {
        if (png->png_data == (uchar *)0x0) {
          uVar10 = png->width * png->height;
          in_RCX = (size_t)uVar10;
          uVar10 = png->bpp * uVar10 + png->height;
          png->png_datalen = uVar10;
          puVar7 = (uchar *)(*png_alloc)((ulong)uVar10);
          uVar10 = local_4c;
          png->png_data = puVar7;
          if (puVar7 != (uchar *)0x0) {
            sVar6 = (size_t)local_4c;
            local_3c = 0;
            local_40 = local_4c;
            local_60 = (*png_alloc)(sVar6);
            if (local_60 != (void *)0x0) {
              puVar8 = (undefined8 *)(*png_alloc)(0x70);
              png->zs = puVar8;
              if (puVar8 == (undefined8 *)0x0) {
                iVar18 = -6;
              }
              else {
                puVar8[0xc] = 0;
                puVar8[0xd] = 0;
                puVar8[10] = 0;
                puVar8[0xb] = 0;
                puVar8[8] = 0;
                puVar8[9] = 0;
                puVar8[6] = 0;
                puVar8[7] = 0;
                puVar8[4] = 0;
                puVar8[5] = 0;
                puVar8[2] = 0;
                puVar8[3] = 0;
                *puVar8 = 0;
                puVar8[1] = 0;
                iVar3 = inflateInit_(puVar8,"1.2.11",0x70);
                iVar18 = -7;
                if (iVar3 == 0) {
                  puVar8[3] = png->png_data;
                  *(uint *)(puVar8 + 4) = png->png_datalen;
                  do {
                    sVar6 = file_read(png,local_60,sVar6,in_RCX);
                    uVar17 = (ulong)local_40;
                    if (sVar6 != uVar17) {
                      png_end_inflate(png);
                      (*png_free)(local_60);
                      iVar18 = -1;
                      goto LAB_001ae2ab;
                    }
                    uVar4 = crc32(0,0,0);
                    uVar4 = crc32(uVar4,"IDAT",4);
                    uVar5 = crc32(uVar4,local_60,uVar17);
                    file_read_ul(png,&local_44);
                    if (local_44 != uVar5) {
                      iVar18 = -5;
                      goto LAB_001ae566;
                    }
                    puVar8 = (undefined8 *)png->zs;
                    if (puVar8 == (undefined8 *)0x0) {
                      iVar18 = -6;
                      goto LAB_001ae566;
                    }
                    *puVar8 = local_60;
                    *(uint *)(puVar8 + 1) = local_40;
                    uVar5 = inflate(puVar8);
                    if (1 < uVar5) {
                      __printf_chk(1,"%s\n",puVar8[6]);
LAB_001ae553:
                      iVar18 = -7;
                      goto LAB_001ae566;
                    }
                    if (*(int *)(puVar8 + 1) != 0) goto LAB_001ae553;
                    file_read_ul(png,&local_40);
                    sVar6 = (size_t)local_40;
                    if (uVar10 < local_40) {
                      (*png_free)(local_60);
                      uVar10 = local_40;
                      sVar6 = (size_t)local_40;
                      local_60 = (*png_alloc)(sVar6);
                      if (local_60 == (void *)0x0) {
                        png_end_inflate(png);
                        iVar18 = -6;
                        goto LAB_001ae2ab;
                      }
                    }
                    sVar9 = file_read(png,&local_3c,4,in_RCX);
                    if (sVar9 != 4) {
                      iVar18 = -1;
                      goto LAB_001ae566;
                    }
                  } while (local_3c == 0x54414449);
                  iVar18 = 0;
LAB_001ae566:
                  if (local_3c == 0x444e4549) {
                    iVar18 = 1;
                  }
                  (*png_free)(local_60);
                  png_end_inflate(png);
                  goto LAB_001ae2ab;
                }
              }
              png_end_inflate(png);
              (*png_free)(local_60);
              goto LAB_001ae2ab;
            }
          }
          iVar18 = -6;
        }
      }
      else {
        iVar18 = 0;
        file_read(png,(void *)0x0,(ulong)(local_4c + 4),in_RCX);
      }
    }
    goto LAB_001ae2ab;
  }
  if (iVar18 == 1) {
    puVar7 = png->png_data;
    if (png->png_datalen == 0) {
      iVar18 = 0;
    }
    else {
      bVar2 = png->bpp;
      uVar17 = (ulong)(uint)bVar2;
      uVar10 = 0;
      uVar5 = 0;
      do {
        bVar11 = puVar7[uVar10];
        uVar1 = uVar10 + 1;
        if ((png->depth == '\x10') && (uVar12 = png->width * (uint)bVar2, uVar12 != 0)) {
          uVar15 = 0;
          do {
            *(ushort *)(puVar7 + uVar15 + uVar1) =
                 CONCAT11(puVar7[uVar1 + (int)uVar15],puVar7[uVar10 + 2 + (int)uVar15]);
            uVar15 = uVar15 + 2;
          } while (uVar15 < uVar12);
        }
        if (4 < bVar11) {
          iVar18 = -8;
          goto LAB_001ae80c;
        }
        uVar10 = (uint)bVar2;
        uVar12 = (uint)bVar2;
        switch(bVar11) {
        case 0:
          puVar13 = data + uVar5;
          __n = (size_t)(png->width * uVar10);
LAB_001ae7a8:
          memcpy(puVar13,puVar7 + uVar1,__n);
          break;
        case 1:
          uVar10 = png->width * uVar10;
          if (0 < (int)uVar10) {
            uVar15 = 0;
            uVar14 = '\0';
            do {
              if (uVar17 <= uVar15) {
                uVar14 = data[uVar15 + -uVar17 + (ulong)uVar5];
              }
              data[uVar15 + uVar5] = puVar7[uVar15 + uVar1] + uVar14;
              uVar15 = uVar15 + 1;
            } while (uVar10 != uVar15);
          }
          break;
        case 2:
          if (uVar5 == 0) {
            __n = (size_t)(int)(png->width * uVar10);
            puVar13 = data;
            goto LAB_001ae7a8;
          }
          uVar10 = png->width * uVar10;
          if (0 < (int)uVar10) {
            uVar15 = 0;
            do {
              data[uVar15 + uVar5] =
                   data[uVar15 + ((ulong)uVar5 - (ulong)uVar10)] + puVar7[uVar15 + uVar1];
              uVar15 = uVar15 + 1;
            } while (uVar15 != uVar10);
          }
          break;
        case 3:
          if (uVar5 == 0) {
            uVar10 = png->width * uVar12;
            if (0 < (int)uVar10) {
              uVar15 = 0;
              bVar11 = 0;
              do {
                if (uVar17 <= uVar15) {
                  bVar11 = data[uVar15 - uVar17];
                }
                data[uVar15] = (bVar11 >> 1) + puVar7[uVar15 + uVar1];
                uVar15 = uVar15 + 1;
              } while (uVar10 != uVar15);
            }
          }
          else {
            uVar10 = png->width * uVar12;
            if (0 < (int)uVar10) {
              uVar15 = 0;
              uVar16 = 0;
              do {
                if (uVar17 <= uVar15) {
                  uVar16 = (uint)data[uVar15 + -uVar17 + (ulong)uVar5];
                }
                data[uVar15 + uVar5] =
                     (char)(uVar16 + data[uVar15 + ((ulong)uVar5 - (ulong)uVar10)] >> 1) +
                     puVar7[uVar15 + uVar1];
                uVar15 = uVar15 + 1;
              } while (uVar15 != uVar10);
            }
          }
          break;
        case 4:
          if (uVar5 == 0) {
            uVar10 = png->width * uVar12;
            prev_line = (uchar *)0x0;
            puVar13 = data;
          }
          else {
            uVar10 = png->width * uVar12;
            prev_line = data + uVar5 + -(ulong)uVar10;
            puVar13 = data + uVar5;
          }
          png_filter_paeth(uVar12,puVar7 + uVar1,puVar13,prev_line,uVar10);
        }
        iVar18 = png->width * uVar12;
        uVar5 = uVar5 + iVar18;
        uVar10 = iVar18 + uVar1;
      } while (uVar10 < png->png_datalen);
      iVar18 = 0;
LAB_001ae80c:
      puVar7 = png->png_data;
    }
  }
  else {
    if (png->png_data != (uchar *)0x0) goto LAB_001ae826;
    puVar7 = (uchar *)0x0;
  }
  (*png_free)(puVar7);
  png->png_data = (uchar *)0x0;
LAB_001ae826:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar18;
}

Assistant:

int png_get_data(png_t* png, unsigned char* data)
{
	int result = PNG_NO_ERROR;
	png->png_data = 0;
	png->zs = 0;

	while(result == PNG_NO_ERROR)
	{
		result = png_process_chunk(png);
	}

	if(result != PNG_DONE)
	{
		if(!png->png_data)
		{
			png_free(png->png_data);
			png->png_data = 0;
		}
		return result;
	}

	result = png_unfilter(png, data);

	png_free(png->png_data); 
	png->png_data = 0;

	return result;
}